

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::add_child
          (tag_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag)

{
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var1;
  exception_t<cfgfile::string_trait_t> *this_00;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::add_child(cfgfile::tag_t<cfgfile::string_trait_t>&)::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>const*)_1_>>
                    ((this->m_child_tags).
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_child_tags).
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,tag);
  if (_Var1._M_current ==
      (this->m_child_tags).
      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d0._M_dataplus._M_p = (pointer)tag;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_equals_val<cfgfile::tag_t<cfgfile::string_trait_t>*const>>
                      ((this->m_child_tags).
                       super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var1._M_current ==
        (this->m_child_tags).
        super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_d0._M_dataplus._M_p = (pointer)tag;
      std::
      vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
      ::emplace_back<cfgfile::tag_t<cfgfile::string_trait_t>*>
                ((vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
                  *)&this->m_child_tags,(tag_t<cfgfile::string_trait_t> **)&local_d0);
      tag->m_parent = this;
    }
    return;
  }
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Tag with name \"","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_f0,local_f0 + local_e8);
  std::operator+(&local_90,&local_b0,&tag->m_name);
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"\" already exists in parent tag \"","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_130,local_130 + local_128);
  std::operator+(&local_70,&local_90,&local_110);
  std::operator+(&local_d0,&local_70,&this->m_name);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\".","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_170,local_170 + local_168);
  std::operator+(&local_50,&local_d0,&local_150);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void add_child( tag_t< Trait > & tag )
	{
		if( std::find_if( m_child_tags.cbegin(), m_child_tags.cend(),
			[ &tag ] ( const tag_t< Trait > * t )
			{
				return ( tag.name() == t->name() );
			} ) != m_child_tags.cend() )
		{
			throw exception_t< Trait > (
				Trait::from_ascii( "Tag with name \"" ) +
				tag.name() +
				Trait::from_ascii( "\" already exists in parent tag \"" ) +
				this->name() +
				Trait::from_ascii( "\"." ) );
		}

		if( std::find( m_child_tags.cbegin(), m_child_tags.cend(), &tag ) ==
			m_child_tags.cend() )
		{
			m_child_tags.push_back( &tag );

			tag.set_parent( this );
		}
	}